

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOutputConverter.cxx
# Opt level: O0

string * __thiscall
cmOutputConverter::ConvertDirectorySeparatorsForShell
          (string *__return_storage_ptr__,cmOutputConverter *this,string *source)

{
  undefined1 uVar1;
  bool bVar2;
  cmState *pcVar3;
  ulong uVar4;
  char *pcVar5;
  undefined1 *puVar6;
  char local_4a [2];
  char *local_48;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  undefined1 local_21;
  string *local_20;
  string *source_local;
  cmOutputConverter *this_local;
  string *result;
  
  local_21 = 0;
  local_20 = source;
  source_local = (string *)this;
  this_local = (cmOutputConverter *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)source);
  pcVar3 = GetState(this);
  bVar2 = cmState::UseMSYSShell(pcVar3);
  if ((((bVar2) && ((this->LinkScriptShell & 1U) == 0)) &&
      (uVar4 = std::__cxx11::string::size(), 2 < uVar4)) &&
     (pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__),
     *pcVar5 == ':')) {
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    uVar1 = *puVar6;
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar6 = uVar1;
    puVar6 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    *puVar6 = 0x2f;
  }
  pcVar3 = GetState(this);
  bVar2 = cmState::UseWindowsShell(pcVar3);
  if (bVar2) {
    local_40._M_current = (char *)std::__cxx11::string::begin();
    local_48 = (char *)std::__cxx11::string::end();
    local_4a[1] = 0x2f;
    local_4a[0] = '\\';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_40,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_48,local_4a + 1,local_4a);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmOutputConverter::ConvertDirectorySeparatorsForShell(
  const std::string& source) const
{
  std::string result = source;
  // For the MSYS shell convert drive letters to posix paths, so
  // that c:/some/path becomes /c/some/path.  This is needed to
  // avoid problems with the shell path translation.
  if (this->GetState()->UseMSYSShell() && !this->LinkScriptShell) {
    if (result.size() > 2 && result[1] == ':') {
      result[1] = result[0];
      result[0] = '/';
    }
  }
  if (this->GetState()->UseWindowsShell()) {
    std::replace(result.begin(), result.end(), '/', '\\');
  }
  return result;
}